

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Operation<duckdb::timestamp_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::timestamp_t,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (ArgMinMaxState<duckdb::timestamp_t,_duckdb::string_t> *state,timestamp_t *x,
               string_t *y,AggregateBinaryInput *binary)

{
  unsigned_long *puVar1;
  AggregateBinaryInput *pAVar2;
  AggregateBinaryInput *in_R9;
  bool bVar3;
  string_t new_value;
  string_t y_data;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized != false) {
    y_data.value.pointer.ptr = (char *)binary;
    y_data.value._0_8_ = (y->value).pointer.ptr;
    Execute<duckdb::timestamp_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::timestamp_t,duckdb::string_t>>
              ((ArgMinMaxBase<duckdb::LessThan,false> *)state,
               (ArgMinMaxState<duckdb::timestamp_t,_duckdb::string_t> *)x->value,
               (timestamp_t)*(int64_t *)&y->value,y_data,in_R9);
    return;
  }
  puVar1 = (binary->right_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  pAVar2 = binary;
  if ((puVar1 != (unsigned_long *)0x0) &&
     (pAVar2 = (AggregateBinaryInput *)binary->ridx,
     (puVar1[(ulong)pAVar2 >> 6] >> ((ulong)pAVar2 & 0x3f) & 1) == 0)) {
    return;
  }
  puVar1 = (binary->left_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    (state->super_ArgMinMaxStateBase).arg_null = false;
  }
  else {
    pAVar2 = (AggregateBinaryInput *)binary->lidx;
    bVar3 = (puVar1[(ulong)pAVar2 >> 6] >> ((ulong)pAVar2 & 0x3f) & 1) == 0;
    (state->super_ArgMinMaxStateBase).arg_null = bVar3;
    if (bVar3) goto LAB_019d7809;
  }
  (state->arg).value = x->value;
LAB_019d7809:
  new_value.value.pointer.ptr = (char *)pAVar2;
  new_value.value._0_8_ = (y->value).pointer.ptr;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)&state->value,*(string_t **)&y->value,new_value);
  (state->super_ArgMinMaxStateBase).is_initialized = true;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}